

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Dependency>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> values)

{
  ArrayPtr<const_unsigned_char> *dupe;
  size_t size;
  ArrayPtr<capnp::_::RawBrandedSchema::Dependency> AVar1;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar2;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> local_50;
  Dependency *local_40;
  size_t local_38;
  
  size = values.size_;
  if (size == 0) {
    AVar1 = (ArrayPtr<capnp::_::RawBrandedSchema::Dependency>)ZEXT816(0);
  }
  else {
    local_40 = values.ptr;
    local_38 = size << 4;
    kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
    find<0ul,kj::ArrayPtr<unsigned_char_const>&>
              ((Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *)
               &local_50,(ArrayPtr<const_unsigned_char> *)&this->dedupTable);
    if (local_50.ptr == (uchar *)0x0) {
      AVar1 = kj::Arena::allocateArray<capnp::_::RawBrandedSchema::Dependency>(&this->arena,size);
      memcpy(AVar1.ptr,values.ptr,size << 4);
      local_50.size_ = AVar1.size_ << 4;
      local_50.ptr = (uchar *)AVar1.ptr;
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_50);
    }
    else {
      AVar1.size_ = size;
      AVar1.ptr = *(Dependency **)local_50.ptr;
    }
  }
  AVar2.ptr = AVar1.ptr;
  AVar2.size_ = AVar1.size_;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_SOME(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe.begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}